

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int get_old_new(char *dir,FileName *varray,char *afile,char *vfile)

{
  FileName *pFVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  FileName *centry;
  FileName *pFVar10;
  char ver [16];
  char vbuf [16];
  int highest_p;
  char vless [4096];
  char name [4096];
  char to_file [4096];
  
  strcpy(name,afile);
  separate_version(name,ver,1);
  pcVar7 = dir;
  pcVar8 = dir;
  pcVar4 = vfile;
  if (varray->version_no == 0xffffffff) {
    if ((ver[0] == '\0') || (ver._0_2_ == 0x31)) {
      strcpy(afile,name);
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '.';
      (afile + sVar5)[1] = '~';
      afile[sVar5 + 2] = '\0';
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '1';
      (afile + sVar5)[1] = '\0';
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '~';
      (afile + sVar5)[1] = '\0';
      pcVar4 = dir;
      for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar4, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar4 = pcVar8;
      }
      if (pcVar7 + -1 == pcVar4) {
        if (pcVar4 == dir) {
          vfile[0] = '/';
          vfile[1] = '\0';
        }
        else {
          strcpy(vfile,dir);
        }
      }
      else {
        strcpy(vfile,dir);
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '/';
        (vfile + sVar5)[1] = '\0';
      }
      strcat(vfile,afile);
      pcVar4 = dir;
      for (pcVar7 = dir; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar4, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar4 = pcVar8;
      }
      if (pcVar7 + -1 == pcVar4) {
        if (pcVar4 == dir) {
          afile[0] = '/';
          afile[1] = '\0';
        }
        else {
          strcpy(afile,dir);
        }
      }
      else {
        strcpy(afile,dir);
        sVar5 = strlen(afile);
        (afile + sVar5)[0] = '/';
        (afile + sVar5)[1] = '\0';
      }
      strcat(afile,name);
      return 1;
    }
    for (; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar7, *pcVar8 != '\0'));
        pcVar8 = pcVar8 + 1) {
      pcVar7 = pcVar9;
    }
LAB_001185f5:
    if (pcVar8 + -1 == pcVar7) {
      if (pcVar7 == dir) {
        vfile[0] = '/';
        vfile[1] = '\0';
      }
      else {
        strcpy(vfile,dir);
      }
    }
    else {
      strcpy(vfile,dir);
      sVar5 = strlen(vfile);
      (vfile + sVar5)[0] = '/';
      (vfile + sVar5)[1] = '\0';
    }
    strcat(vfile,afile);
    goto LAB_00118743;
  }
  iVar2 = get_versionless(varray,vless,dir);
  pFVar10 = varray;
  if (iVar2 != 0) {
    if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
      if (ver[0] == '\0') {
        pcVar4 = vless;
        strcpy(vfile,pcVar4);
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '.';
        (vfile + sVar5)[1] = '~';
        vfile[sVar5 + 2] = '\0';
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '1';
        (vfile + sVar5)[1] = '\0';
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '~';
        (vfile + sVar5)[1] = '\0';
        goto LAB_00118743;
      }
      uVar3 = strtoul(ver,(char **)0x0,10);
      if ((int)uVar3 != 1) {
        for (; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar7, *pcVar8 != '\0'));
            pcVar8 = pcVar8 + 1) {
          pcVar7 = pcVar9;
        }
        goto LAB_001185f5;
      }
      strcpy(afile,name);
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '.';
      (afile + sVar5)[1] = '~';
      afile[sVar5 + 2] = '\0';
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '1';
      (afile + sVar5)[1] = '\0';
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '~';
      (afile + sVar5)[1] = '\0';
      pcVar4 = dir;
      for (pcVar7 = dir; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar4, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        pcVar4 = pcVar8;
      }
      if (pcVar7 + -1 == pcVar4) {
        if (pcVar4 == dir) {
          vfile[0] = '/';
          vfile[1] = '\0';
        }
        else {
          strcpy(vfile,dir);
        }
      }
      else {
        strcpy(vfile,dir);
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '/';
        (vfile + sVar5)[1] = '\0';
      }
      strcat(vfile,afile);
    }
    else {
      iVar2 = check_vless_link(vless,varray,to_file,&highest_p);
      if (iVar2 == 0) {
        return 0;
      }
      if (to_file[0] != '\0') {
        if (ver[0] != '\0') {
          uVar3 = strtoul(ver,(char **)0x0,10);
          for (; pFVar10->version_no != 0xffffffff; pFVar10 = pFVar10 + 1) {
            if (pFVar10->version_no == (uint)uVar3) goto LAB_00118381;
          }
          strcpy(vless,varray->name);
          separate_version(vless,vbuf,1);
          pcVar7 = dir;
          for (pcVar8 = dir; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar7, *pcVar8 != '\0'))
              ; pcVar8 = pcVar8 + 1) {
            pcVar7 = pcVar9;
          }
          if (pcVar8 + -1 == pcVar7) {
            if (pcVar7 == dir) {
              afile[0] = '/';
              afile[1] = '\0';
            }
            else {
              strcpy(afile,dir);
            }
          }
          else {
            strcpy(afile,dir);
            sVar5 = strlen(afile);
            (afile + sVar5)[0] = '/';
            (afile + sVar5)[1] = '\0';
          }
          strcat(afile,vless);
          strcpy(vfile,afile);
          if (ver[0] != '\0') {
            sVar5 = strlen(vfile);
            (vfile + sVar5)[0] = '.';
            (vfile + sVar5)[1] = '~';
            vfile[sVar5 + 2] = '\0';
            strcat(vfile,ver);
            sVar5 = strlen(vfile);
            (vfile + sVar5)[0] = '~';
            (vfile + sVar5)[1] = '\0';
          }
          goto LAB_00118743;
        }
        for (; (pcVar4 = pcVar8, *pcVar8 == '/' || (pcVar4 = pcVar7, *pcVar8 != '\0'));
            pcVar8 = pcVar8 + 1) {
          pcVar7 = pcVar4;
        }
        goto LAB_001182ce;
      }
      if (ver[0] == '\0') {
        uVar3 = (ulong)(varray->version_no + 1);
      }
      else {
        uVar3 = strtoul(ver,(char **)0x0,10);
        uVar6 = varray->version_no;
        if (uVar6 + 1 != (uint)uVar3) {
          while (uVar6 != 0xffffffff) {
            if (uVar6 == (uint)uVar3) goto LAB_0011864d;
            uVar6 = pFVar10[1].version_no;
            pFVar10 = pFVar10 + 1;
          }
          pFVar10 = varray + -1;
          do {
            pFVar1 = pFVar10 + 1;
            pFVar10 = pFVar10 + 1;
          } while (pFVar1->version_no != 0xffffffff);
          strcpy(afile,pFVar10->name);
          if (ver[0] != '\0') {
            sVar5 = strlen(afile);
            (afile + sVar5)[0] = '.';
            (afile + sVar5)[1] = '~';
            afile[sVar5 + 2] = '\0';
            strcat(afile,ver);
            sVar5 = strlen(afile);
            (afile + sVar5)[0] = '~';
            (afile + sVar5)[1] = '\0';
          }
          for (; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar7, *pcVar8 != '\0'));
              pcVar8 = pcVar8 + 1) {
            pcVar7 = pcVar9;
          }
          goto LAB_001185f5;
        }
        uVar3 = uVar3 & 0xffffffff;
      }
      sprintf(vbuf,"%u",uVar3);
      strcpy(vfile,vless);
      if (vbuf[0] != '\0') {
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '.';
        (vfile + sVar5)[1] = '~';
        vfile[sVar5 + 2] = '\0';
        strcat(vfile,vbuf);
        sVar5 = strlen(vfile);
        (vfile + sVar5)[0] = '~';
        (vfile + sVar5)[1] = '\0';
      }
    }
    pcVar4 = vless;
    goto LAB_00118743;
  }
  if (ver[0] != '\0') {
    uVar3 = strtoul(ver,(char **)0x0,10);
    for (; pFVar10->version_no != 0xffffffff; pFVar10 = pFVar10 + 1) {
      if (pFVar10->version_no == (uint)uVar3) goto LAB_001181f0;
    }
    pFVar10 = varray + -1;
    do {
      pFVar1 = pFVar10 + 1;
      pFVar10 = pFVar10 + 1;
    } while (pFVar1->version_no != 0xffffffff);
    strcpy(afile,pFVar10->name);
    if (ver[0] != '\0') {
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '.';
      (afile + sVar5)[1] = '~';
      afile[sVar5 + 2] = '\0';
      strcat(afile,ver);
      sVar5 = strlen(afile);
      (afile + sVar5)[0] = '~';
      (afile + sVar5)[1] = '\0';
    }
    for (; (pcVar9 = pcVar8, *pcVar8 == '/' || (pcVar9 = pcVar7, *pcVar8 != '\0'));
        pcVar8 = pcVar8 + 1) {
      pcVar7 = pcVar9;
    }
    goto LAB_001185f5;
  }
  for (; (pcVar4 = pcVar8, *pcVar8 == '/' || (pcVar4 = pcVar7, *pcVar8 != '\0'));
      pcVar8 = pcVar8 + 1) {
    pcVar7 = pcVar4;
  }
LAB_001182ce:
  if (pcVar8 + -1 == pcVar7) {
    if (pcVar7 == dir) {
      afile[0] = '/';
      afile[1] = '\0';
    }
    else {
      strcpy(afile,dir);
    }
  }
  else {
    strcpy(afile,dir);
    sVar5 = strlen(afile);
    (afile + sVar5)[0] = '/';
    (afile + sVar5)[1] = '\0';
  }
  goto LAB_001186a9;
LAB_0011864d:
  for (; (pcVar4 = pcVar8, *pcVar8 == '/' || (pcVar4 = pcVar7, *pcVar8 != '\0'));
      pcVar8 = pcVar8 + 1) {
    pcVar7 = pcVar4;
  }
  goto LAB_00118667;
LAB_00118381:
  for (; (pcVar4 = pcVar8, *pcVar8 == '/' || (pcVar4 = pcVar7, *pcVar8 != '\0'));
      pcVar8 = pcVar8 + 1) {
    pcVar7 = pcVar4;
  }
  goto LAB_00118667;
LAB_001181f0:
  for (; (pcVar4 = pcVar8, *pcVar8 == '/' || (pcVar4 = pcVar7, *pcVar8 != '\0'));
      pcVar8 = pcVar8 + 1) {
    pcVar7 = pcVar4;
  }
LAB_00118667:
  if (pcVar8 + -1 == pcVar7) {
    if (pcVar7 == dir) {
      afile[0] = '/';
      afile[1] = '\0';
    }
    else {
      strcpy(afile,dir);
    }
  }
  else {
    strcpy(afile,dir);
    sVar5 = strlen(afile);
    (afile + sVar5)[0] = '/';
    (afile + sVar5)[1] = '\0';
  }
LAB_001186a9:
  strcat(afile,pFVar10->name);
  pcVar4 = afile;
  afile = vfile;
LAB_00118743:
  strcpy(afile,pcVar4);
  return 1;
}

Assistant:

static int get_old_new(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (NoFileP(varray)) {
    /*
     * If there is no file with such name, "old/new" file is always
     * recognized.
     */
    if (*ver == '\0' || strcmp(ver, "1") == 0) {
      /*
       * If version is not specified or 1 is specified,
       * we can return versionless file as afile.
       */
      ConcNameAndVersion(name, "1", afile);
      ConcDirAndName(dir, afile, vfile);
      ConcDirAndName(dir, name, afile);
      return (1);
    } else {
      /*
       * A version other than 1 is specified.  "New" file
       * is recognized as if.
       */
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  }

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      }
      /*
       * There is not a file with the specified version in varray.
       * The specified file can be recognized as if.
       * Most user will hope to create a new file in same case as
       * old.   One of case sensitive names in the files are stored
       * in the trail marker entry in varray by get_version_array
       * routine.
       * We will use it, although we cannot say all of the gathered
       * files has the name in same case.
       */
      while (varray->version_no != LASTVERSIONARRAY) varray++;
      ConcNameAndVersion(varray->name, ver, afile);
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are recognized as if.
         */
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          }
          /*
           * There is not a file with the specified
           * version in varray.  The specified file can
           * be recognized as if.
           * Most user will hope to create a new file in
           * same case as old.   One of case sensitive
           * names in the files are stored in the trail
           * marker entry in varray by get_version_array
           * routine.
           * We will use it, although we cannot say all
           * of the gathered files has the name in same
           * case.
           */
          while (varray->version_no != LASTVERSIONARRAY) varray++;
          ConcNameAndVersion(varray->name, ver, afile);
          ConcDirAndName(dir, afile, vfile);
          strcpy(afile, vfile);
          return (1);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        }
        /*
         * There is not a file with the specified
         * version in varray.  The specified file can
         * be recognized as if.
         * Most user will hope to create a new file in
         * same case as old.   We will use the name of
         * the highest versioned file as the name of the
         * new file.
         */
        FindHighestVersion(varray, entry, max_no);
        strcpy(vless, entry->name);
        separate_version(vless, vbuf, 1);
        ConcDirAndName(dir, vless, afile);
        ConcNameAndVersion(afile, ver, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  }
}